

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset_ensure.h
# Opt level: O0

cellid_t * __thiscall trimesh::dataset_t::max_fct(dataset_t *this,cellid_t c)

{
  reference pvVar1;
  ostream *poVar2;
  runtime_error *this_00;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [380];
  int local_14;
  dataset_t *pdStack_10;
  cellid_t c_local;
  dataset_t *this_local;
  
  local_14 = c;
  pdStack_10 = this;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_cell_mxfct,(long)c);
  if (*pvVar1 != invalid_cellid) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,"Failed to assert condition ");
    poVar2 = std::operator<<(poVar2,"m_cell_mxfct[c] == invalid_cellid");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"at (");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset_ensure.h"
                            );
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = std::operator<<(poVar2,"max_fct");
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2e);
    std::operator<<(poVar2,") \n ");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this_00,local_1d0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_cell_mxfct,(long)local_14);
  return pvVar1;
}

Assistant:

inline cellid_t& dataset_t::max_fct(cellid_t c)
  {ASSERT(m_cell_mxfct[c] == invalid_cellid);return m_cell_mxfct[c];}